

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

void __thiscall rengine::OpenGLRenderer::OpenGLRenderer(OpenGLRenderer *this)

{
  *(undefined8 *)((long)&(this->super_Renderer).m_surface + 4) = 0;
  (this->super_Renderer).m_fillColor.y = 0.0;
  (this->super_Renderer).m_fillColor.z = 0.0;
  (this->super_Renderer).m_sceneRoot = (Node *)0x0;
  (this->super_Renderer).m_surface = (Surface *)0x0;
  (this->super_Renderer).m_fillColor.w = 1.0;
  (this->super_Renderer)._vptr_Renderer = (_func_int **)&PTR__OpenGLRenderer_0011ba60;
  (this->prog_texture).super_OpenGLShaderProgram.m_id = 0;
  (this->prog_texture).super_OpenGLShaderProgram.m_attributeCount = 0;
  (this->prog_texture_bgr).super_OpenGLShaderProgram.m_id = 0;
  (this->prog_texture_bgr).super_OpenGLShaderProgram.m_attributeCount = 0;
  (this->prog_alphaTexture).super_Program.super_OpenGLShaderProgram.m_id = 0;
  (this->prog_alphaTexture).super_Program.super_OpenGLShaderProgram.m_attributeCount = 0;
  (this->prog_solid).super_Program.super_OpenGLShaderProgram.m_id = 0;
  (this->prog_solid).super_Program.super_OpenGLShaderProgram.m_attributeCount = 0;
  (this->prog_colorFilter).super_Program.super_OpenGLShaderProgram.m_id = 0;
  (this->prog_colorFilter).super_Program.super_OpenGLShaderProgram.m_attributeCount = 0;
  (this->prog_blur).super_Program.super_OpenGLShaderProgram.m_id = 0;
  (this->prog_blur).super_Program.super_OpenGLShaderProgram.m_attributeCount = 0;
  (this->prog_shadow).super_BlurProgram.super_Program.super_OpenGLShaderProgram.m_id = 0;
  (this->prog_shadow).super_BlurProgram.super_Program.super_OpenGLShaderProgram.m_attributeCount = 0
  ;
  this->m_numLayeredNodes = 0;
  this->m_numTextureNodes = 0;
  this->m_numRectangleNodes = 0;
  this->m_numTransformNodes = 0;
  this->m_numTransformNodesWith3d = 0;
  this->m_additionalQuads = 0;
  this->m_vertexIndex = 0;
  *(undefined8 *)&this->m_elementIndex = 0;
  this->m_vertices = (vec2 *)0x0;
  this->m_elements = (Element *)0x0;
  (this->m_proj).m[0xc] = 0.0;
  (this->m_proj).m[0xd] = 0.0;
  (this->m_proj).m[0xe] = 0.0;
  (this->m_proj).m[0xf] = 1.0;
  (this->m_proj).m[8] = 0.0;
  (this->m_proj).m[9] = 0.0;
  (this->m_proj).m[10] = 1.0;
  (this->m_proj).m[0xb] = 0.0;
  (this->m_proj).m[4] = 0.0;
  (this->m_proj).m[5] = 1.0;
  (this->m_proj).m[6] = 0.0;
  (this->m_proj).m[7] = 0.0;
  (this->m_proj).m[0] = 1.0;
  (this->m_proj).m[1] = 0.0;
  (this->m_proj).m[2] = 0.0;
  (this->m_proj).m[3] = 0.0;
  (this->m_proj).type = 0;
  (this->m_m2d).m[0xc] = 0.0;
  (this->m_m2d).m[0xd] = 0.0;
  (this->m_m2d).m[0xe] = 0.0;
  (this->m_m2d).m[0xf] = 1.0;
  (this->m_m2d).m[8] = 0.0;
  (this->m_m2d).m[9] = 0.0;
  (this->m_m2d).m[10] = 1.0;
  (this->m_m2d).m[0xb] = 0.0;
  (this->m_m2d).m[4] = 0.0;
  (this->m_m2d).m[5] = 1.0;
  (this->m_m2d).m[6] = 0.0;
  (this->m_m2d).m[7] = 0.0;
  (this->m_m2d).m[0] = 1.0;
  (this->m_m2d).m[1] = 0.0;
  (this->m_m2d).m[2] = 0.0;
  (this->m_m2d).m[3] = 0.0;
  (this->m_m2d).type = 0;
  (this->m_m3d).m[0xc] = 0.0;
  (this->m_m3d).m[0xd] = 0.0;
  (this->m_m3d).m[0xe] = 0.0;
  (this->m_m3d).m[0xf] = 1.0;
  (this->m_m3d).m[8] = 0.0;
  (this->m_m3d).m[9] = 0.0;
  (this->m_m3d).m[10] = 1.0;
  (this->m_m3d).m[0xb] = 0.0;
  (this->m_m3d).m[4] = 0.0;
  (this->m_m3d).m[5] = 1.0;
  (this->m_m3d).m[6] = 0.0;
  (this->m_m3d).m[7] = 0.0;
  (this->m_m3d).m[0] = 1.0;
  (this->m_m3d).m[1] = 0.0;
  (this->m_m3d).m[2] = 0.0;
  (this->m_m3d).m[3] = 0.0;
  *(undefined8 *)((long)&this->m_activeShader + 4) = 0;
  this->m_vertexBuffer = 0;
  this->m_fbo = 0;
  (this->m_texturePool).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->m_activeShader = (Program *)0x0;
  (this->m_texturePool).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_texturePool).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_layerBoundingBox).br.x = 0.0;
  (this->m_layerBoundingBox).br.y = 0.0;
  (this->m_surfaceSize).x = 0.0;
  (this->m_surfaceSize).y = 0.0;
  *(undefined8 *)&(this->m_m3d).type = 0;
  (this->m_layerBoundingBox).tl.x = 0.0;
  (this->m_layerBoundingBox).tl.y = 0.0;
  this->m_matrixState = 0xffffffff;
  this->field_0x1f8 = this->field_0x1f8 & 0xf8;
  initialize(this);
  return;
}

Assistant:

inline OpenGLRenderer::OpenGLRenderer()
    : m_numLayeredNodes(0)
    , m_numTextureNodes(0)
    , m_numRectangleNodes(0)
    , m_numTransformNodes(0)
    , m_numTransformNodesWith3d(0)
    , m_additionalQuads(0)
    , m_vertexIndex(0)
    , m_elementIndex(0)
    , m_vertices(0)
    , m_elements(0)
    , m_farPlane(0)
    , m_activeShader(0)
    , m_texCoordBuffer(0)
    , m_vertexBuffer(0)
    , m_fbo(0)
    , m_matrixState(UpdateAllPrograms)
    , m_render3d(false)
    , m_layered(false)
    , m_srgb(false)
{
    initialize();
}